

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtfmtsym.cpp
# Opt level: O1

void __thiscall
icu_63::DateFormatSymbols::createZoneStrings(DateFormatSymbols *this,UnicodeString **otherStrings)

{
  int iVar1;
  bool bVar2;
  UnicodeString **ppUVar3;
  long *plVar4;
  UnicodeString *pUVar5;
  long lVar6;
  UnicodeString *src;
  UMemory *this_00;
  long lVar7;
  ulong unaff_R15;
  ulong uVar8;
  bool bVar9;
  
  src = (UnicodeString *)otherStrings;
  ppUVar3 = (UnicodeString **)uprv_malloc_63((long)this->fZoneStringsRowCount << 3);
  this->fZoneStrings = ppUVar3;
  bVar2 = true;
  if (ppUVar3 != (UnicodeString **)0x0) {
    if (this->fZoneStringsRowCount < 1) {
      unaff_R15 = 0;
    }
    else {
      unaff_R15 = 0;
      do {
        iVar1 = this->fZoneStringsColCount;
        lVar7 = (long)(int)(iVar1 + (uint)(iVar1 == 0));
        lVar6 = lVar7 * 0x40;
        this_00 = (UMemory *)(lVar6 + 8);
        if (iVar1 < 0) {
          this_00 = (UMemory *)0xffffffffffffffff;
        }
        plVar4 = (long *)UMemory::operator_new__(this_00,(size_t)src);
        if (plVar4 == (long *)0x0) {
          pUVar5 = (UnicodeString *)0x0;
        }
        else {
          *plVar4 = lVar7;
          pUVar5 = (UnicodeString *)(plVar4 + 1);
          lVar7 = 0;
          do {
            *(undefined ***)((long)plVar4 + lVar7 + 8) = &PTR__UnicodeString_0048be70;
            *(undefined2 *)((long)plVar4 + lVar7 + 0x10) = 2;
            lVar7 = lVar7 + 0x40;
          } while (lVar6 != lVar7);
        }
        this->fZoneStrings[unaff_R15] = pUVar5;
        bVar9 = this->fZoneStrings[unaff_R15] == (UnicodeString *)0x0;
        bVar2 = !bVar9;
        if (bVar9) break;
        if (0 < this->fZoneStringsColCount) {
          lVar7 = 0;
          lVar6 = 0;
          do {
            src = (UnicodeString *)
                  ((long)&(otherStrings[unaff_R15]->super_Replaceable).super_UObject._vptr_UObject +
                  lVar7);
            icu_63::UnicodeString::fastCopyFrom
                      ((UnicodeString *)
                       ((long)&(this->fZoneStrings[unaff_R15]->super_Replaceable).super_UObject.
                               _vptr_UObject + lVar7),src);
            lVar6 = lVar6 + 1;
            lVar7 = lVar7 + 0x40;
          } while (lVar6 < this->fZoneStringsColCount);
        }
        unaff_R15 = unaff_R15 + 1;
      } while ((long)unaff_R15 < (long)this->fZoneStringsRowCount);
    }
  }
  if (!bVar2) {
    if (-1 < (int)unaff_R15) {
      uVar8 = unaff_R15 & 0xffffffff;
      do {
        pUVar5 = this->fZoneStrings[uVar8];
        if (pUVar5 != (UnicodeString *)0x0) {
          lVar6 = *(long *)((long)&pUVar5[-1].fUnion + 0x30);
          if (lVar6 != 0) {
            lVar6 = lVar6 << 6;
            do {
              icu_63::UnicodeString::~UnicodeString
                        ((UnicodeString *)
                         ((long)&pUVar5[-1].super_Replaceable.super_UObject._vptr_UObject + lVar6));
              lVar6 = lVar6 + -0x40;
            } while (lVar6 != 0);
          }
          UMemory::operator_delete__((UMemory *)((long)&pUVar5[-1].fUnion + 0x30),src);
        }
        bVar2 = 0 < (long)uVar8;
        uVar8 = uVar8 - 1;
      } while (bVar2);
    }
    uprv_free_63(this->fZoneStrings);
    this->fZoneStrings = (UnicodeString **)0x0;
  }
  return;
}

Assistant:

void
DateFormatSymbols::createZoneStrings(const UnicodeString *const * otherStrings)
{
    int32_t row, col;
    UBool failed = FALSE;

    fZoneStrings = (UnicodeString **)uprv_malloc(fZoneStringsRowCount * sizeof(UnicodeString *));
    if (fZoneStrings != NULL) {
        for (row=0; row<fZoneStringsRowCount; ++row)
        {
            fZoneStrings[row] = newUnicodeStringArray(fZoneStringsColCount);
            if (fZoneStrings[row] == NULL) {
                failed = TRUE;
                break;
            }
            for (col=0; col<fZoneStringsColCount; ++col) {
                // fastCopyFrom() - see assignArray comments
                fZoneStrings[row][col].fastCopyFrom(otherStrings[row][col]);
            }
        }
    }
    // If memory allocation failed, roll back and delete fZoneStrings
    if (failed) {
        for (int i = row; i >= 0; i--) {
            delete[] fZoneStrings[i];
        }
        uprv_free(fZoneStrings);
        fZoneStrings = NULL;
    }
}